

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::~SmallArray
          (SmallArray<InstructionVMEvalContext::StackFrame_*,_32U> *this)

{
  SmallArray<InstructionVMEvalContext::StackFrame_*,_32U> *this_local;
  
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<InstructionVMEvalContext::StackFrame*>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<InstructionVMEvalContext::StackFrame*>
                (this->allocator,this->data,(ulong)this->max);
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}